

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O0

void __thiscall miniros::ServiceClientLink::ServiceClientLink(ServiceClientLink *this)

{
  ServiceClientLink *in_RDI;
  unique_ptr<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  *in_stack_ffffffffffffffb8;
  ConnectionPtr *this_00;
  
  std::enable_shared_from_this<miniros::ServiceClientLink>::enable_shared_from_this
            ((enable_shared_from_this<miniros::ServiceClientLink> *)0x4a4a7c);
  in_RDI->_vptr_ServiceClientLink = (_func_int **)&PTR__ServiceClientLink_0061f368;
  this_00 = &in_RDI->connection_;
  std::shared_ptr<miniros::Connection>::shared_ptr((shared_ptr<miniros::Connection> *)0x4a4a9d);
  std::weak_ptr<miniros::ServicePublication>::weak_ptr
            ((weak_ptr<miniros::ServicePublication> *)0x4a4ab0);
  in_RDI->persistent_ = false;
  std::
  unique_ptr<miniros::ServiceClientLink::DropWatcher,std::default_delete<miniros::ServiceClientLink::DropWatcher>>
  ::unique_ptr<std::default_delete<miniros::ServiceClientLink::DropWatcher>,void>
            ((unique_ptr<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
              *)this_00);
  std::make_unique<miniros::ServiceClientLink::DropWatcher,miniros::ServiceClientLink&>(in_RDI);
  std::
  unique_ptr<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  ::operator=((unique_ptr<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
               *)this_00,in_stack_ffffffffffffffb8);
  std::
  unique_ptr<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  ::~unique_ptr((unique_ptr<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
                 *)this_00);
  return;
}

Assistant:

ServiceClientLink::ServiceClientLink()
: persistent_(false)
{
    drop_watcher_ = std::make_unique<DropWatcher>(*this);
}